

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O2

nng_err nni_http_server_set_error_page(nni_http_server *s,nng_http_status code,char *html)

{
  nni_list *list;
  bool bVar1;
  nng_err nVar2;
  char *s_00;
  void *item;
  nni_mtx *mtx;
  nng_err nVar3;
  
  s_00 = nni_strdup(html);
  if (s_00 == (char *)0x0) {
    nVar2 = NNG_ENOMEM;
  }
  else {
    mtx = &s->errors_mtx;
    nni_mtx_lock(mtx);
    list = &s->errors;
    for (item = nni_list_first(list); item != (void *)0x0; item = nni_list_next(list,item)) {
      if (*(nng_http_status *)((long)item + 0x10) == code) goto LAB_001236d4;
    }
    item = nni_zalloc(0x20);
    if (item == (void *)0x0) {
      mtx = &s->mtx;
      nVar3 = NNG_ENOMEM;
      bVar1 = false;
    }
    else {
      *(nng_http_status *)((long)item + 0x10) = code;
      nni_list_append(list,item);
LAB_001236d4:
      nni_strfree(*(char **)((long)item + 0x18));
      *(char **)((long)item + 0x18) = s_00;
      nVar3 = NNG_OK;
      bVar1 = true;
    }
    nni_mtx_unlock(mtx);
    nVar2 = NNG_OK;
    if (!bVar1) {
      nni_strfree(s_00);
      nVar2 = nVar3;
    }
  }
  return nVar2;
}

Assistant:

nng_err
nni_http_server_set_error_page(
    nni_http_server *s, nng_http_status code, const char *html)
{
	char   *body;
	nng_err rv;

	// We copy the content, without the trailing NUL.
	if ((body = nni_strdup(html)) == NULL) {
		return (NNG_ENOMEM);
	}
	if ((rv = http_server_set_err(s, code, body)) != 0) {
		nni_strfree(body);
	}
	return (rv);
}